

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

int __thiscall CImage::LoadBmp(CImage *this,char *szFilename)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  unsigned_short *puVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  uint uVar8;
  short sVar9;
  uchar *puVar10;
  long Dummy;
  long biSize;
  _BMPFILEHEADER fh;
  _BMPIMAGEHEADEROLD ih_old;
  uchar BmpPal [256] [4];
  undefined8 local_4b0;
  size_t local_4a8;
  short local_49e [13];
  undefined1 local_484 [8];
  ushort local_47c;
  ushort uStack_47a;
  unsigned_short uStack_476;
  uint local_474;
  unsigned_short local_46a [25];
  char local_438 [1032];
  
  local_4b0 = 0;
  __stream = fopen(szFilename,"rb");
  this->f = (FILE *)__stream;
  if (__stream == (FILE *)0x0) {
    return 0x1e;
  }
  sVar3 = fread(local_49e,0xe,1,__stream);
  if (sVar3 == 1) {
    if (local_49e[0] != 0x4d42) {
      return 0x20;
    }
    sVar3 = fread(&local_4a8,4,1,(FILE *)this->f);
    if (sVar3 == 1) {
      fseek((FILE *)this->f,-4,1);
      if ((long)local_4a8 < 0xd) {
        sVar3 = fread(local_484,local_4a8,1,(FILE *)this->f);
        if (sVar3 != 1) {
          return 0x1f;
        }
        puVar4 = &uStack_476;
        uVar8 = (uint)local_47c;
        local_474 = (uint)uStack_47a;
      }
      else {
        sVar3 = fread(local_484,local_4a8,1,(FILE *)this->f);
        if (sVar3 != 1) {
          return 0x1f;
        }
        puVar4 = local_46a;
        uVar8 = CONCAT22(uStack_47a,local_47c);
      }
      iVar1 = Init(this,uVar8,local_474,*puVar4);
      if (iVar1 != 0) {
        return 0x21;
      }
      if (this->m_BitPerPixel == 0x18) {
        iVar1 = this->m_Xres * 3;
        iVar2 = iVar1 + 3;
        iVar1 = iVar1 + 6;
        if (-1 < iVar2) {
          iVar1 = iVar2;
        }
        if (0 < this->m_Yres) {
          sVar3 = (long)(iVar1 >> 2) * 4 + (long)this->m_Xres * -3;
          puVar10 = this->m_pBitmap + (long)this->m_NumPixel * 3;
          sVar9 = 1;
          do {
            puVar10 = puVar10 + (long)this->m_Xres * -3;
            sVar6 = fread(puVar10,(long)this->m_Xres * 3,1,(FILE *)this->f);
            if (sVar6 != 1) {
              return 0x1f;
            }
            if ((0 < (int)sVar3) && (sVar6 = fread(&local_4b0,sVar3,1,(FILE *)this->f), sVar6 != 1))
            {
              return 0x1f;
            }
            iVar1 = (int)sVar9;
            sVar9 = sVar9 + 1;
          } while (iVar1 < this->m_Yres);
        }
      }
      else {
        if (this->m_BitPerPixel != 8) {
          return 0x22;
        }
        iVar1 = this->m_Xres;
        uVar8 = iVar1 + 6;
        if (-1 < (int)(iVar1 + 3U)) {
          uVar8 = iVar1 + 3U;
        }
        sVar3 = fread(local_438,0x400,1,(FILE *)this->f);
        if (sVar3 != 1) {
          return 0x1f;
        }
        iVar1 = (uVar8 & 0xfffffffc) - iVar1;
        lVar5 = 0x16;
        pcVar7 = local_438 + 2;
        do {
          *(char *)((long)this->m_Pal + lVar5 + -0x16) = pcVar7[-2];
          *(char *)((long)(this->m_Pal + -7) + lVar5) = pcVar7[-1];
          *(char *)((long)this->m_Pal + lVar5 + -0x14) = *pcVar7;
          lVar5 = lVar5 + 3;
          pcVar7 = pcVar7 + 4;
        } while (lVar5 != 0x316);
        if (0 < this->m_Yres) {
          puVar10 = this->m_pBitmap + this->m_NumPixel;
          sVar9 = 1;
          do {
            puVar10 = puVar10 + -(long)this->m_Xres;
            sVar3 = fread(puVar10,(long)this->m_Xres,1,(FILE *)this->f);
            if (sVar3 != 1) {
              return 0x1f;
            }
            if ((0 < iVar1) && (sVar3 = fread(&local_4b0,(long)iVar1,1,(FILE *)this->f), sVar3 != 1)
               ) {
              return 0x1f;
            }
            iVar2 = (int)sVar9;
            sVar9 = sVar9 + 1;
          } while (iVar2 < this->m_Yres);
        }
      }
      fclose((FILE *)this->f);
      return 0;
    }
  }
  return 0x1f;
}

Assistant:

int CImage::LoadBmp(char *szFilename)
{
  _BMPFILEHEADER     fh;
  _BMPIMAGEHEADEROLD ih_old;
  _BMPIMAGEHEADER    ih;
  unsigned char      BmpPal[256][4];
  long int           biSize; 
  long int           SuffLen;
  long int           Dummy = 0;
  unsigned char    * pBuf;
  short              i;
  long int           xres, yres;
  unsigned short     bits;

  if (!(f = fopen(szFilename, "rb"))) return eLoadBmpFileOpen;
  if (fread(&fh, 14, 1, f) != 1) return eLoadBmpFileRead;
  if (fh.bfType != 0x4D42) return eLoadBmpBadFormat;
  if (fread(&biSize, 4, 1, f) != 1) return eLoadBmpFileRead;
  if (biSize > 12)
  {
    fseek( f, -4, SEEK_CUR );
    if (fread(&ih, biSize, 1, f) != 1) return eLoadBmpFileRead;
    xres = ih.biWidth;
    yres = ih.biHeight;
    bits = ih.biBitCount;
  }
  else
  {
    fseek( f, -4, SEEK_CUR );
    if (fread(&ih_old, biSize, 1, f) != 1) return eLoadBmpFileRead;
    xres = ih_old.biWidth;
    yres = ih_old.biHeight;
    bits = ih_old.biBitCount;
  }

  if ( Init( xres, yres, bits ) != 0 ) return eLoadBmpInit;
  if (m_BitPerPixel==8)
  {
    SuffLen=((m_Xres+3)/4)*4-m_Xres;
    if (fread(&BmpPal, 1024, 1, f) != 1) return eLoadBmpFileRead;
    for (i=0; i<256; i++)
    {
      m_Pal[i].b=BmpPal[i][0];
      m_Pal[i].g=BmpPal[i][1];
      m_Pal[i].r=BmpPal[i][2];
    }
    pBuf=m_pBitmap;
    pBuf+=m_NumPixel;
    for (i=0; i<m_Yres; i++)
    {
      pBuf-=m_Xres;
      if (fread(pBuf, m_Xres, 1, f) != 1) return eLoadBmpFileRead;
      if (SuffLen>0) 
      { 
        if (fread(&Dummy, SuffLen, 1, f) != 1) return eLoadBmpFileRead; 
      }
    }
  } 
  else
  if (m_BitPerPixel==24)
  {
    SuffLen=((m_Xres*3+3)/4)*4-(m_Xres*3);
    pBuf=m_pBitmap;
    pBuf+=m_NumPixel*3;
    for (i=0; i<m_Yres; i++)
    {
      pBuf-=m_Xres*3;
      if (fread(pBuf, m_Xres*3, 1, f) != 1) return eLoadBmpFileRead;
      if (SuffLen>0) 
      { 
        if (fread(&Dummy, SuffLen, 1, f) != 1) return eLoadBmpFileRead; 
      }
    }
  } 
  else 
    return eLoadBmpColorDepth;

  fclose(f);

  return 0;
}